

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  int iVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ImVec4 *pIVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  undefined1 auVar10 [16];
  ImDrawCmd IStack_30;
  
  lVar7 = (long)(this->_TextureIdStack).Size;
  if (lVar7 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = (this->_TextureIdStack).Data[lVar7 + -1];
  }
  iVar1 = (this->CmdBuffer).Size;
  lVar7 = (long)iVar1;
  if (lVar7 != 0) {
    pIVar3 = (this->CmdBuffer).Data;
    if ((pIVar3 + lVar7 + -1 != (ImDrawCmd *)0x0) &&
       (((uVar2 = pIVar3[lVar7 + -1].ElemCount, uVar2 == 0 ||
         (pIVar3[lVar7 + -1].TextureId == pvVar8)) &&
        (pIVar3[lVar7 + -1].UserCallback == (ImDrawCallback)0x0)))) {
      if (((1 < iVar1) && (uVar2 == 0)) && (pIVar3[lVar7 + -2].TextureId == pvVar8)) {
        lVar9 = (long)(this->_ClipRectStack).Size;
        pIVar6 = (this->_ClipRectStack).Data + lVar9 + -1;
        if (lVar9 == 0) {
          pIVar6 = &this->_Data->ClipRectFullscreen;
        }
        auVar10[0] = -(*(char *)&pIVar3[lVar7 + -2].ClipRect.x == *(char *)&pIVar6->x);
        auVar10[1] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.x + 1) ==
                      *(char *)((long)&pIVar6->x + 1));
        auVar10[2] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.x + 2) ==
                      *(char *)((long)&pIVar6->x + 2));
        auVar10[3] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.x + 3) ==
                      *(char *)((long)&pIVar6->x + 3));
        auVar10[4] = -(*(char *)&pIVar3[lVar7 + -2].ClipRect.y == *(char *)&pIVar6->y);
        auVar10[5] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.y + 1) ==
                      *(char *)((long)&pIVar6->y + 1));
        auVar10[6] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.y + 2) ==
                      *(char *)((long)&pIVar6->y + 2));
        auVar10[7] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.y + 3) ==
                      *(char *)((long)&pIVar6->y + 3));
        auVar10[8] = -(*(char *)&pIVar3[lVar7 + -2].ClipRect.z == *(char *)&pIVar6->z);
        auVar10[9] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.z + 1) ==
                      *(char *)((long)&pIVar6->z + 1));
        auVar10[10] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.z + 2) ==
                       *(char *)((long)&pIVar6->z + 2));
        auVar10[0xb] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.z + 3) ==
                        *(char *)((long)&pIVar6->z + 3));
        auVar10[0xc] = -(*(char *)&pIVar3[lVar7 + -2].ClipRect.w == *(char *)&pIVar6->w);
        auVar10[0xd] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.w + 1) ==
                        *(char *)((long)&pIVar6->w + 1));
        auVar10[0xe] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.w + 2) ==
                        *(char *)((long)&pIVar6->w + 2));
        auVar10[0xf] = -(*(char *)((long)&pIVar3[lVar7 + -2].ClipRect.w + 3) ==
                        *(char *)((long)&pIVar6->w + 3));
        if (((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff) &&
           (pIVar3[lVar7 + -2].UserCallback == (ImDrawCallback)0x0)) {
          (this->CmdBuffer).Size = iVar1 + -1;
          return;
        }
      }
      pIVar3[lVar7 + -1].TextureId = pvVar8;
      return;
    }
  }
  IStack_30.ElemCount = 0;
  IStack_30.UserCallback = (ImDrawCallback)0x0;
  IStack_30.UserCallbackData = (void *)0x0;
  lVar7 = (long)(this->_ClipRectStack).Size;
  pIVar6 = (this->_ClipRectStack).Data + lVar7 + -1;
  if (lVar7 == 0) {
    pIVar6 = &this->_Data->ClipRectFullscreen;
  }
  uVar4 = pIVar6->x;
  uVar5 = pIVar6->y;
  IStack_30.ClipRect.z = pIVar6->z;
  IStack_30.ClipRect.w = pIVar6->w;
  lVar7 = (long)(this->_TextureIdStack).Size;
  if (lVar7 == 0) {
    IStack_30.TextureId = (void *)0x0;
  }
  else {
    IStack_30.TextureId = (this->_TextureIdStack).Data[lVar7 + -1];
  }
  IStack_30.ClipRect.x = (float)uVar4;
  IStack_30.ClipRect.y = (float)uVar5;
  ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&IStack_30);
  return;
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (curr_cmd->ElemCount == 0 && prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}